

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializer.cpp
# Opt level: O0

string * __thiscall
ser::Serializer::ToString_abi_cxx11_(string *__return_storage_ptr__,Serializer *this)

{
  ostream *poVar1;
  type pFVar2;
  string local_240;
  string local_220;
  string local_200;
  string local_1e0;
  string local_1c0;
  ostringstream local_190 [8];
  ostringstream ss;
  Serializer *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar1 = std::operator<<((ostream *)local_190,"Serializer\n");
  poVar1 = std::operator<<(poVar1,"Directory: ");
  pFVar2 = boost::shared_ptr<ser::FileFormat>::operator->(&this->pFileFormat_);
  FileFormat::directory_abi_cxx11_(&local_1c0,pFVar2);
  poVar1 = std::operator<<(poVar1,(string *)&local_1c0);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"Prefix: ");
  pFVar2 = boost::shared_ptr<ser::FileFormat>::operator->(&this->pFileFormat_);
  FileFormat::prefix_abi_cxx11_(&local_1e0,pFVar2);
  poVar1 = std::operator<<(poVar1,(string *)&local_1e0);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"Globalmetainfo: ");
  MetainfoSet::ToString_abi_cxx11_(&local_200,&this->globalMetainfo_);
  poVar1 = std::operator<<(poVar1,(string *)&local_200);
  poVar1 = std::operator<<(poVar1,"\n");
  FieldsTable::ToString_abi_cxx11_(&local_220,&this->fieldsTable_);
  poVar1 = std::operator<<(poVar1,(string *)&local_220);
  OffsetTable::ToString_abi_cxx11_(&local_240,&this->offsetTable_);
  poVar1 = std::operator<<(poVar1,(string *)&local_240);
  std::operator<<(poVar1,"----------------------------------------------\n");
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string Serializer::ToString() const
{
    std::ostringstream ss;
    ss << "Serializer\n"
       << "Directory: " << pFileFormat_->directory() << "\n"
       << "Prefix: " << pFileFormat_->prefix() << "\n"
       << "Globalmetainfo: " << globalMetainfo_.ToString() << "\n"
       << fieldsTable_.ToString()
       << offsetTable_.ToString()
       << "----------------------------------------------\n";
    return ss.str();
}